

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanobenchmark.cc
# Opt level: O2

void __thiscall
highwayhash::DurationsForInputs::AddItem(DurationsForInputs *this,FuncInput input,float sample)

{
  Item *pIVar1;
  size_t sVar2;
  
  pIVar1 = this->items;
  sVar2 = this->num_items;
  pIVar1[sVar2].input = input;
  pIVar1[sVar2].num_durations = 1;
  *pIVar1[sVar2].durations = sample;
  this->num_items = sVar2 + 1;
  return;
}

Assistant:

void DurationsForInputs::AddItem(const FuncInput input, const float sample) {
  for (size_t i = 0; i < num_items; ++i) {
    NANOBENCHMARK_CHECK(items[i].input != input);
  }
  Item& item = items[num_items];
  item.input = input;
  item.num_durations = 1;
  item.durations[0] = sample;
  ++num_items;
}